

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Shrink(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nFanoutMax;
  int iVar2;
  Gia_Man_t *pGVar3;
  char *pcVar4;
  char *pcVar5;
  uint local_40;
  uint local_3c;
  
  local_3c = 0;
  Extra_UtilGetoptReset();
  nFanoutMax = 0x32;
  local_40 = 0;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"Nlvh"), iVar2 = globalUtilOptind, iVar1 != 0x4e) {
      if (iVar1 == -1) {
        pGVar3 = pAbc->pGia;
        if (pGVar3 == (Gia_Man_t *)0x0) {
          pcVar4 = "Abc_CommandAbc9Shrink(): There is no AIG.\n";
        }
        else {
          if (pGVar3->vMapping != (Vec_Int_t *)0x0) {
            iVar2 = Gia_ManLutSizeMax(pGVar3);
            if (iVar2 < 5) {
              pGVar3 = Gia_ManMapShrink4(pAbc->pGia,local_40,local_3c);
            }
            else if (iVar2 < 7) {
              pGVar3 = Gia_ManMapShrink6(pAbc->pGia,nFanoutMax,local_40,local_3c);
            }
            else {
              pGVar3 = (Gia_Man_t *)0x0;
              Abc_Print(-1,"Abc_CommandAbc9Shrink(): Works only for 4-LUTs and 6-LUTs.\n");
            }
            if (pGVar3 == (Gia_Man_t *)0x0) {
              return 0;
            }
            Abc_FrameUpdateGia(pAbc,pGVar3);
            return 0;
          }
          pcVar4 = "Abc_CommandAbc9Shrink(): Mapping of the AIG is not defined.\n";
        }
        iVar2 = -1;
        goto LAB_0022172e;
      }
      if (iVar1 == 0x6c) {
        local_40 = local_40 ^ 1;
      }
      else {
        if (iVar1 != 0x76) goto LAB_0022169a;
        local_3c = local_3c ^ 1;
      }
    }
    if (argc <= globalUtilOptind) break;
    nFanoutMax = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar2 + 1;
    if ((int)nFanoutMax < 0) {
LAB_0022169a:
      Abc_Print(-2,"usage: &shrink [-N num] [-lvh]\n");
      Abc_Print(-2,"\t         performs fast shrinking using current mapping\n");
      Abc_Print(-2,"\t-N num : the max fanout count to skip a divisor [default = %d]\n",
                (ulong)nFanoutMax);
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (local_40 == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-l     : toggle level update during shrinking [default = %s]\n",pcVar4);
      if (local_3c == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
      pcVar4 = "\t-h     : print the command usage\n";
      iVar2 = -2;
LAB_0022172e:
      Abc_Print(iVar2,pcVar4);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-N\" should be followed by a char string.\n");
  goto LAB_0022169a;
}

Assistant:

int Abc_CommandAbc9Shrink( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp = NULL;
    int nLutSize;
    int c,fVerbose = 0;
    int fKeepLevel = 0;
    int nFanoutMax = 50;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Nlvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by a char string.\n" );
                goto usage;
            }
            nFanoutMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFanoutMax < 0 )
                goto usage;
            break;
        case 'l':
            fKeepLevel ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Shrink(): There is no AIG.\n" );
        return 1;
    }
    if ( !Gia_ManHasMapping(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9Shrink(): Mapping of the AIG is not defined.\n" );
        return 1;
    }
    nLutSize = Gia_ManLutSizeMax( pAbc->pGia );
    if ( nLutSize <= 4 )
        pTemp = Gia_ManMapShrink4( pAbc->pGia, fKeepLevel, fVerbose );
    else if ( nLutSize <= 6 )
        pTemp = Gia_ManMapShrink6( pAbc->pGia, nFanoutMax, fKeepLevel, fVerbose );
    else
        Abc_Print( -1, "Abc_CommandAbc9Shrink(): Works only for 4-LUTs and 6-LUTs.\n" );
    if ( pTemp )
        Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &shrink [-N num] [-lvh]\n" );
    Abc_Print( -2, "\t         performs fast shrinking using current mapping\n" );
    Abc_Print( -2, "\t-N num : the max fanout count to skip a divisor [default = %d]\n", nFanoutMax );
    Abc_Print( -2, "\t-l     : toggle level update during shrinking [default = %s]\n", fKeepLevel? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}